

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O1

uint _computeNumberBoolOperation<unsigned_int>(TokenType type,NumberToken *lhs,NumberToken *rhs)

{
  undefined6 in_register_0000003a;
  bool bVar1;
  string local_30;
  
  switch((int)CONCAT62(in_register_0000003a,type)) {
  case 0x46:
    bVar1 = (lhs->num).f32 == (rhs->num).f32;
    break;
  case 0x47:
    bVar1 = (lhs->num).f32 != (rhs->num).f32;
    break;
  case 0x48:
    bVar1 = (uint)(lhs->num).f32 < (uint)(rhs->num).f32;
    break;
  case 0x49:
    bVar1 = (uint)(lhs->num).f32 <= (uint)(rhs->num).f32;
    break;
  case 0x4a:
    bVar1 = (uint)(rhs->num).f32 < (uint)(lhs->num).f32;
    break;
  case 0x4b:
    bVar1 = (uint)(rhs->num).f32 <= (uint)(lhs->num).f32;
    break;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unknown operation","");
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0xb3,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
  }
  return (uint)bVar1;
}

Assistant:

static R _computeNumberBoolOperation(TokenType type, const NumberToken &lhs, const NumberToken &rhs) {
	switch (type) {
	case TokenType::TOK_OP_LT:
		return lhs.getNumber<R>() < rhs.getNumber<R>();
	case TokenType::TOK_OP_GT:
		return lhs.getNumber<R>() > rhs.getNumber<R>();
	case TokenType::TOK_OP_LEQ:
		return lhs.getNumber<R>() <= rhs.getNumber<R>();
	case TokenType::TOK_OP_GEQ:
		return lhs.getNumber<R>() >= rhs.getNumber<R>();
	case TokenType::TOK_OP_EQ:
		return lhs.getNumber<R>() == rhs.getNumber<R>();
	case TokenType::TOK_OP_NQ:
		return lhs.getNumber<R>() != rhs.getNumber<R>();
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}